

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_rolemaskproxymodel.cpp
# Opt level: O0

void RoleMaskProxyModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  QList<int> *newRoles;
  bool bVar3;
  int iVar4;
  QMetaType QVar5;
  RoleMaskProxyModel *_t_3;
  void *_v_1;
  RoleMaskProxyModel *_t_2;
  QList<int> *local_58;
  void *_v;
  RoleMaskProxyModel *_t_1;
  int *result;
  QMetaType local_38;
  QMetaType local_30;
  QObject *local_28;
  RoleMaskProxyModel *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  _t = (RoleMaskProxyModel *)_a;
  _a_local._0_4_ = _id;
  _a_local._4_4_ = _c;
  __id_local = _o;
  if (_c == InvokeMetaMethod) {
    local_28 = _o;
    switch(_id) {
    case 0:
      mergeDisplayEditChanged((RoleMaskProxyModel *)_o,(bool)(*_a[1] & 1));
      break;
    case 1:
      transparentIfEmptyChanged((RoleMaskProxyModel *)_o,(bool)(*_a[1] & 1));
      break;
    case 2:
      maskHeaderDataChanged((RoleMaskProxyModel *)_o,(bool)(*_a[1] & 1));
      break;
    case 3:
      maskedRolesChanged((RoleMaskProxyModel *)_o);
      break;
    case 4:
      maskedDataChanged((RoleMaskProxyModel *)_o,(QModelIndex *)_a[1],(QModelIndex *)_a[2],
                        (QVector<int> *)_a[3]);
    }
  }
  else if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 4) {
      if (*_a[1] == 2) {
        QVar5 = QMetaType::fromType<QList<int>>();
        **(undefined8 **)_t = QVar5.d_ptr;
      }
      else {
        memset(&local_38,0,8);
        QMetaType::QMetaType(&local_38);
        **(undefined8 **)_t = local_38.d_ptr;
      }
    }
    else {
      memset(&local_30,0,8);
      QMetaType::QMetaType(&local_30);
      **(undefined8 **)_t = local_30.d_ptr;
    }
  }
  else if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    if (pcVar2 == mergeDisplayEditChanged &&
        (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *puVar1 = 0;
    }
    else {
      pcVar2 = *_a[1];
      if (pcVar2 == transparentIfEmptyChanged &&
          (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
        *puVar1 = 1;
      }
      else {
        pcVar2 = *_a[1];
        if (pcVar2 == maskHeaderDataChanged &&
            (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
          *puVar1 = 2;
        }
        else {
          pcVar2 = *_a[1];
          if (pcVar2 == maskedRolesChanged &&
              (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
            *puVar1 = 3;
          }
          else {
            pcVar2 = *_a[1];
            if (pcVar2 == maskedDataChanged &&
                (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
              *puVar1 = 4;
            }
          }
        }
      }
    }
  }
  else if (_c == RegisterPropertyMetaType) {
    if (_id == 3) {
      iVar4 = qRegisterMetaType<QList<int>>();
      **(int **)_t = iVar4;
    }
    else {
      *(undefined4 *)*_a = 0xffffffff;
    }
  }
  else if (_c == ReadProperty) {
    local_58 = (QList<int> *)*_a;
    _v = _o;
    switch(_id) {
    case 0:
      bVar3 = transparentIfEmpty((RoleMaskProxyModel *)_o);
      *(bool *)&(local_58->d).d = bVar3;
      break;
    case 1:
      bVar3 = mergeDisplayEdit((RoleMaskProxyModel *)_o);
      *(bool *)&(local_58->d).d = bVar3;
      break;
    case 2:
      bVar3 = maskHeaderData((RoleMaskProxyModel *)_o);
      *(bool *)&(local_58->d).d = bVar3;
      break;
    case 3:
      maskedRoles((QList<int> *)&_t_2,(RoleMaskProxyModel *)_o);
      QList<int>::operator=(local_58,(QList<int> *)&_t_2);
      QList<int>::~QList((QList<int> *)&_t_2);
    }
  }
  else if (_c == WriteProperty) {
    newRoles = (QList<int> *)*_a;
    switch(_id) {
    case 0:
      setTransparentIfEmpty((RoleMaskProxyModel *)_o,(bool)(*(byte *)&(newRoles->d).d & 1));
      break;
    case 1:
      setMergeDisplayEdit((RoleMaskProxyModel *)_o,(bool)(*(byte *)&(newRoles->d).d & 1));
      break;
    case 2:
      setMaskHeaderData((RoleMaskProxyModel *)_o,(bool)(*(byte *)&(newRoles->d).d & 1));
      break;
    case 3:
      setMaskedRoles((RoleMaskProxyModel *)_o,newRoles);
    }
  }
  else if ((_c == ResetProperty) && (_id == 3)) {
    clearMaskedRoles((RoleMaskProxyModel *)_o);
  }
  return;
}

Assistant:

void RoleMaskProxyModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<RoleMaskProxyModel *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->mergeDisplayEditChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->transparentIfEmptyChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->maskHeaderDataChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->maskedRolesChanged(); break;
        case 4: _t->maskedDataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[3]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 2:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (RoleMaskProxyModel::*)(bool );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&RoleMaskProxyModel::mergeDisplayEditChanged)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (RoleMaskProxyModel::*)(bool );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&RoleMaskProxyModel::transparentIfEmptyChanged)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (RoleMaskProxyModel::*)(bool );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&RoleMaskProxyModel::maskHeaderDataChanged)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = void (RoleMaskProxyModel::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&RoleMaskProxyModel::maskedRolesChanged)) {
                *result = 3;
                return;
            }
        }
        {
            using _t = void (RoleMaskProxyModel::*)(const QModelIndex & , const QModelIndex & , const QVector<int> & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&RoleMaskProxyModel::maskedDataChanged)) {
                *result = 4;
                return;
            }
        }
    } else if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 3:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QList<int> >(); break;
        }
    }

#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<RoleMaskProxyModel *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< bool*>(_v) = _t->transparentIfEmpty(); break;
        case 1: *reinterpret_cast< bool*>(_v) = _t->mergeDisplayEdit(); break;
        case 2: *reinterpret_cast< bool*>(_v) = _t->maskHeaderData(); break;
        case 3: *reinterpret_cast< QList<int>*>(_v) = _t->maskedRoles(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<RoleMaskProxyModel *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTransparentIfEmpty(*reinterpret_cast< bool*>(_v)); break;
        case 1: _t->setMergeDisplayEdit(*reinterpret_cast< bool*>(_v)); break;
        case 2: _t->setMaskHeaderData(*reinterpret_cast< bool*>(_v)); break;
        case 3: _t->setMaskedRoles(*reinterpret_cast< QList<int>*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
        auto *_t = static_cast<RoleMaskProxyModel *>(_o);
        (void)_t;
        switch (_id) {
        case 3: _t->clearMaskedRoles(); break;
        default: break;
        }
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}